

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix44<double> * Imath_3_2::Matrix44<double>::multiply(Matrix44<double> *a,Matrix44<double> *b)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  Matrix44<double> *in_RDI;
  
  dVar7 = a->x[0][0];
  dVar8 = a->x[0][1];
  dVar9 = a->x[0][2];
  dVar10 = a->x[0][3];
  dVar11 = a->x[1][0];
  dVar12 = a->x[1][1];
  dVar13 = a->x[1][2];
  dVar14 = a->x[1][3];
  dVar15 = a->x[2][0];
  dVar36 = a->x[2][1];
  dVar16 = b->x[0][0];
  dVar17 = b->x[0][1];
  dVar18 = b->x[1][0];
  dVar19 = b->x[1][1];
  dVar20 = b->x[2][0];
  dVar21 = b->x[2][1];
  dVar22 = b->x[3][0];
  dVar23 = b->x[3][1];
  dVar6 = dVar10 * dVar23 + dVar9 * dVar21 + dVar7 * dVar17 + dVar8 * dVar19;
  dVar24 = a->x[2][2];
  dVar25 = a->x[2][3];
  dVar26 = a->x[3][0];
  dVar37 = a->x[3][1];
  dVar27 = a->x[3][2];
  dVar1 = a->x[3][3];
  auVar2._8_4_ = SUB84(dVar6,0);
  auVar2._0_8_ = dVar10 * dVar22 + dVar9 * dVar20 + dVar7 * dVar16 + dVar8 * dVar18;
  auVar2._12_4_ = (int)((ulong)dVar6 >> 0x20);
  *(undefined1 (*) [16])in_RDI->x[0] = auVar2;
  dVar28 = b->x[1][2];
  dVar29 = b->x[1][3];
  dVar30 = b->x[0][2];
  dVar31 = b->x[0][3];
  dVar32 = b->x[2][2];
  dVar33 = b->x[2][3];
  dVar34 = b->x[3][2];
  dVar35 = b->x[3][3];
  in_RDI->x[0][2] = dVar10 * dVar34 + dVar9 * dVar32 + dVar7 * dVar30 + dVar8 * dVar28;
  in_RDI->x[0][3] = dVar10 * dVar35 + dVar9 * dVar33 + dVar7 * dVar31 + dVar8 * dVar29;
  dVar6 = dVar14 * dVar23 + dVar13 * dVar21 + dVar11 * dVar17 + dVar19 * dVar12;
  auVar3._8_4_ = SUB84(dVar6,0);
  auVar3._0_8_ = dVar14 * dVar22 + dVar13 * dVar20 + dVar11 * dVar16 + dVar18 * dVar12;
  auVar3._12_4_ = (int)((ulong)dVar6 >> 0x20);
  *(undefined1 (*) [16])in_RDI->x[1] = auVar3;
  in_RDI->x[1][2] = dVar14 * dVar34 + dVar13 * dVar32 + dVar11 * dVar30 + dVar12 * dVar28;
  in_RDI->x[1][3] = dVar14 * dVar35 + dVar13 * dVar33 + dVar11 * dVar31 + dVar12 * dVar29;
  dVar6 = dVar25 * dVar23 + dVar24 * dVar21 + dVar15 * dVar17 + dVar19 * dVar36;
  auVar4._8_4_ = SUB84(dVar6,0);
  auVar4._0_8_ = dVar25 * dVar22 + dVar24 * dVar20 + dVar15 * dVar16 + dVar18 * dVar36;
  auVar4._12_4_ = (int)((ulong)dVar6 >> 0x20);
  *(undefined1 (*) [16])in_RDI->x[2] = auVar4;
  in_RDI->x[2][2] = dVar25 * dVar34 + dVar24 * dVar32 + dVar15 * dVar30 + dVar36 * dVar28;
  in_RDI->x[2][3] = dVar25 * dVar35 + dVar24 * dVar33 + dVar15 * dVar31 + dVar36 * dVar29;
  dVar6 = dVar23 * dVar1 + dVar21 * dVar27 + dVar17 * dVar26 + dVar19 * dVar37;
  auVar5._8_4_ = SUB84(dVar6,0);
  auVar5._0_8_ = dVar22 * dVar1 + dVar20 * dVar27 + dVar16 * dVar26 + dVar18 * dVar37;
  auVar5._12_4_ = (int)((ulong)dVar6 >> 0x20);
  *(undefined1 (*) [16])in_RDI->x[3] = auVar5;
  in_RDI->x[3][2] = dVar1 * dVar34 + dVar27 * dVar32 + dVar26 * dVar30 + dVar37 * dVar28;
  in_RDI->x[3][3] = dVar1 * dVar35 + dVar27 * dVar33 + dVar26 * dVar31 + dVar37 * dVar29;
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE inline IMATH_CONSTEXPR14 Matrix44<T>
Matrix44<T>::multiply (const Matrix44& a, const Matrix44& b) IMATH_NOEXCEPT
{
    const auto a00 = a.x[0][0];
    const auto a01 = a.x[0][1];
    const auto a02 = a.x[0][2];
    const auto a03 = a.x[0][3];

    const auto c00 =
        a00 * b.x[0][0] + a01 * b.x[1][0] + a02 * b.x[2][0] + a03 * b.x[3][0];
    const auto c01 =
        a00 * b.x[0][1] + a01 * b.x[1][1] + a02 * b.x[2][1] + a03 * b.x[3][1];
    const auto c02 =
        a00 * b.x[0][2] + a01 * b.x[1][2] + a02 * b.x[2][2] + a03 * b.x[3][2];
    const auto c03 =
        a00 * b.x[0][3] + a01 * b.x[1][3] + a02 * b.x[2][3] + a03 * b.x[3][3];

    const auto a10 = a.x[1][0];
    const auto a11 = a.x[1][1];
    const auto a12 = a.x[1][2];
    const auto a13 = a.x[1][3];

    const auto c10 =
        a10 * b.x[0][0] + a11 * b.x[1][0] + a12 * b.x[2][0] + a13 * b.x[3][0];
    const auto c11 =
        a10 * b.x[0][1] + a11 * b.x[1][1] + a12 * b.x[2][1] + a13 * b.x[3][1];
    const auto c12 =
        a10 * b.x[0][2] + a11 * b.x[1][2] + a12 * b.x[2][2] + a13 * b.x[3][2];
    const auto c13 =
        a10 * b.x[0][3] + a11 * b.x[1][3] + a12 * b.x[2][3] + a13 * b.x[3][3];

    const auto a20 = a.x[2][0];
    const auto a21 = a.x[2][1];
    const auto a22 = a.x[2][2];
    const auto a23 = a.x[2][3];

    const auto c20 =
        a20 * b.x[0][0] + a21 * b.x[1][0] + a22 * b.x[2][0] + a23 * b.x[3][0];
    const auto c21 =
        a20 * b.x[0][1] + a21 * b.x[1][1] + a22 * b.x[2][1] + a23 * b.x[3][1];
    const auto c22 =
        a20 * b.x[0][2] + a21 * b.x[1][2] + a22 * b.x[2][2] + a23 * b.x[3][2];
    const auto c23 =
        a20 * b.x[0][3] + a21 * b.x[1][3] + a22 * b.x[2][3] + a23 * b.x[3][3];

    const auto a30 = a.x[3][0];
    const auto a31 = a.x[3][1];
    const auto a32 = a.x[3][2];
    const auto a33 = a.x[3][3];

    const auto c30 =
        a30 * b.x[0][0] + a31 * b.x[1][0] + a32 * b.x[2][0] + a33 * b.x[3][0];
    const auto c31 =
        a30 * b.x[0][1] + a31 * b.x[1][1] + a32 * b.x[2][1] + a33 * b.x[3][1];
    const auto c32 =
        a30 * b.x[0][2] + a31 * b.x[1][2] + a32 * b.x[2][2] + a33 * b.x[3][2];
    const auto c33 =
        a30 * b.x[0][3] + a31 * b.x[1][3] + a32 * b.x[2][3] + a33 * b.x[3][3];
    return Matrix44 (
        c00,
        c01,
        c02,
        c03,
        c10,
        c11,
        c12,
        c13,
        c20,
        c21,
        c22,
        c23,
        c30,
        c31,
        c32,
        c33);
}